

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceCountQuantity::createProgram(SurfaceCountQuantity *this)

{
  shared_ptr<polyscope::render::ShaderProgram> *this_00;
  pointer ppVar1;
  element_type *peVar2;
  ShaderProgram *program;
  Engine *pEVar3;
  pointer __x;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  vector<double,_std::allocator<double>_> value;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  pEVar3 = render::engine;
  std::__cxx11::string::string((string *)&pos,"RAYCAST_SPHERE",&local_129);
  std::__cxx11::string::string((string *)&local_e0,"SPHERE_PROPAGATE_VALUE",&local_12a);
  std::__cxx11::string::string(local_c0,"SHADE_COLORMAP_VALUE",&local_12b);
  __l._M_len = 2;
  __l._M_array = &local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&value,__l,&local_12c);
  (*pEVar3->_vptr_Engine[0x23])(&local_a0,pEVar3,&pos,&value,0);
  this_00 = &this->program;
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&value);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&pos);
  pos.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pos.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppVar1 = (this->entries).
           super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->entries).
             super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != ppVar1; __x = __x + 1) {
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::push_back(&pos,&__x->first);
    std::vector<double,_std::allocator<double>_>::push_back(&value,&__x->second);
  }
  peVar2 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_50,"a_position",(allocator *)&local_e0);
  (*peVar2->_vptr_ShaderProgram[0x10])(peVar2,local_50,&pos,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_50);
  peVar2 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_70,"a_value",(allocator *)&local_e0);
  (*peVar2->_vptr_ShaderProgram[0x12])(peVar2,local_70,&value,0,0,0xffffffffffffffff);
  std::__cxx11::string::~string(local_70);
  peVar2 = (this_00->
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_90,"t_colormap",(allocator *)&local_e0);
  (*peVar2->_vptr_ShaderProgram[0x19])(peVar2,local_90,&(this->colorMap).value,0);
  std::__cxx11::string::~string(local_90);
  pEVar3 = render::engine;
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  SurfaceMesh::getMaterial_abi_cxx11_
            (&local_e0,
             (this->super_SurfaceMeshQuantity).super_Quantity<polyscope::SurfaceMesh>.parent);
  render::Engine::setMaterial(pEVar3,program,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&value.super__Vector_base<double,_std::allocator<double>_>);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&pos.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 );
  return;
}

Assistant:

void SurfaceCountQuantity::createProgram() {

  program = render::engine->requestShader("RAYCAST_SPHERE", {"SPHERE_PROPAGATE_VALUE", "SHADE_COLORMAP_VALUE"});


  // Fill buffers
  std::vector<glm::vec3> pos;
  std::vector<double> value;
  for (auto& e : entries) {
    pos.push_back(e.first);
    value.push_back(e.second);
  }


  // Store data in buffers
  program->setAttribute("a_position", pos);
  program->setAttribute("a_value", value);

  program->setTextureFromColormap("t_colormap", colorMap.get());
  render::engine->setMaterial(*program, parent.getMaterial());
}